

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O1

void pputrast(char *fn,uchar *hd,float *bf,int sx,int sy,int r)

{
  uint uVar1;
  ssize_t sVar2;
  uchar *puVar3;
  uint extraout_EDX;
  ulong unaff_RBX;
  char *unaff_RBP;
  uint uVar4;
  uchar *puVar5;
  undefined1 *puVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uchar *puVar11;
  uchar *__buf;
  float __x;
  uchar c;
  undefined1 uStack_8d;
  uint uStack_8c;
  ulong uStack_88;
  long lStack_80;
  ulong uStack_78;
  ulong uStack_70;
  uchar *puStack_68;
  float *pfStack_60;
  uchar *puStack_58;
  code *pcStack_50;
  uchar local_45;
  uint local_44;
  uchar *local_40;
  long local_38;
  
  puVar3 = (uchar *)(ulong)(uint)sx;
  uVar8 = (ulong)(uint)r;
  puVar11 = (uchar *)(ulong)(uint)sy;
  puVar5 = (uchar *)0x180;
  pcStack_50 = (code *)0x102c06;
  iVar7 = sy;
  local_44 = sx;
  uVar1 = creat(fn,0x180);
  __buf = puVar11;
  if ((int)uVar1 < 1) {
LAB_00102ca8:
    pcStack_50 = (code *)0x102cad;
    pputrast_cold_1();
  }
  else {
    unaff_RBP = (char *)(ulong)uVar1;
    fn = (char *)(ulong)uVar1;
    pcStack_50 = (code *)0x102c1f;
    puVar5 = hd;
    sVar2 = write(uVar1,hd,0x20);
    if (sVar2 == 0x20) {
      if (0 < sy) {
        unaff_RBX = (ulong)local_44;
        local_38 = (long)r << 2;
        hd = (uchar *)0x0;
        __buf = &local_45;
        puVar3 = puVar11;
        local_40 = puVar11;
        do {
          if (0 < (int)local_44) {
            uVar8 = 0;
            do {
              local_45 = (uchar)(int)bf[uVar8];
              pcStack_50 = (code *)0x102c71;
              puVar5 = __buf;
              fn = unaff_RBP;
              sVar2 = write(uVar1,__buf,1);
              if (sVar2 != 1) {
                pcStack_50 = (code *)0x102ca8;
                pputrast_cold_3();
                goto LAB_00102ca8;
              }
              uVar8 = uVar8 + 1;
            } while (unaff_RBX != uVar8);
          }
          hd = hd + 1;
          bf = (float *)((long)bf + local_38);
        } while (hd != local_40);
      }
      close(uVar1);
      return;
    }
  }
  pcStack_50 = Bpputrast;
  pputrast_cold_2();
  uVar4 = 0x180;
  uStack_8c = extraout_EDX;
  uStack_78 = unaff_RBX;
  uStack_70 = uVar8;
  puStack_68 = hd;
  pfStack_60 = bf;
  puStack_58 = __buf;
  pcStack_50 = (code *)unaff_RBP;
  uVar1 = creat(fn,0x180);
  if (0 < (int)uVar1) {
    if (0 < (int)puVar3) {
      uVar8 = (ulong)uStack_8c;
      lStack_80 = (long)iVar7 << 2;
      uVar10 = 0;
      uStack_88 = (ulong)puVar3 & 0xffffffff;
      do {
        if (0 < (int)uStack_8c) {
          uVar9 = 0;
          do {
            uStack_8d = (undefined1)(int)*(float *)(puVar5 + uVar9 * 4);
            fn = (char *)(ulong)uVar1;
            puVar6 = &uStack_8d;
            sVar2 = write(uVar1,&uStack_8d,1);
            uVar4 = (uint)puVar6;
            if (sVar2 != 1) {
              Bpputrast_cold_2();
              goto LAB_00102d60;
            }
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
        }
        uVar10 = uVar10 + 1;
        puVar5 = puVar5 + lStack_80;
      } while (uVar10 != uStack_88);
    }
    close(uVar1);
    return;
  }
LAB_00102d60:
  Bpputrast_cold_1();
  __x = 0.0;
  if (0 < (int)uVar4) {
    uVar8 = 0;
    do {
      __x = __x + *(float *)(fn + uVar8 * 4) * *(float *)(fn + uVar8 * 4);
      uVar8 = uVar8 + 1;
    } while (uVar4 != uVar8);
  }
  if (0.0 <= __x) {
    return;
  }
  sqrtf(__x);
  return;
}

Assistant:

void pputrast(fn,hd,bf,sx,sy,r)
char *fn ;
unsigned char hd[H] ;
float bf[X*Y] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = creat(fn,0600)) > 0) { ;
    if (write(fd,hd,H) == H) {
      for (i = 0 ; i < sy ; i++) {
        for (j = 0 ; j < sx ; j++) {
          c = (unsigned char)bf[r*i + j] ;
          if (write(fd,&c,sizeof(c)) != 1) {
            error(7) ;
          }
        }
      }
    }
    else {
      error(8) ;
    }
  }
  else {
    error(9) ;
  }
  close(fd) ;
}